

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexArrayTest.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::MultiVertexArrayStorageTests::init
          (MultiVertexArrayStorageTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  Spec local_60;
  Spec spec;
  
  spec.arrays.
  super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  spec.arrays.
  super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  spec.arrays.
  super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  spec.primitive = PRIMITIVE_TRIANGLES;
  spec.drawCount = 0x100;
  spec.first = 0;
  deqp::gls::MultiVertexArrayTest::Spec::Spec(&local_60,&spec);
  addStorageCases(this,&local_60,3);
  std::
  _Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
  ::~_Vector_base(&local_60.arrays.
                   super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                 );
  std::
  _Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
  ::~_Vector_base(&spec.arrays.
                   super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                 );
  return extraout_EAX;
}

Assistant:

void MultiVertexArrayStorageTests::init (void)
{
	// Test different storages
	int arrayCounts[] = {3};

	MultiVertexArrayTest::Spec spec;

	spec.primitive	= Array::PRIMITIVE_TRIANGLES;
	spec.drawCount	= 256;
	spec.first		= 0;

	for (int arrayCountNdx = 0; arrayCountNdx < DE_LENGTH_OF_ARRAY(arrayCounts); arrayCountNdx++)
		addStorageCases(spec, arrayCounts[arrayCountNdx]);
}